

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

void nn_bipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm *pnVar1;
  nn_list_item *it;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  
  uVar4 = (ulong)(uint)src;
  uVar2 = (ulong)*(uint *)&self[1].fn;
  switch(*(uint *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
LAB_00121da3:
        nn_bipc_start_listening((nn_bipc *)self);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 1;
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0xfe;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 1;
      uVar5 = 0x102;
    }
    break;
  case 2:
    pnVar1 = self[8].owner;
    if (pnVar1 == (nn_fsm *)srcptr) {
      if (type == 0x85b7) {
        it = nn_list_end((nn_list *)&self[8].ctx);
        nn_list_insert((nn_list *)&self[8].ctx,(nn_list_item *)&pnVar1[0x14].stopped.item,it);
        self[8].owner = (nn_fsm *)0x0;
        nn_bipc_start_accepting((nn_bipc *)self);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar5 = 0x11a;
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_BIPC_SRC_AIPC",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
                ,0x120);
        goto LAB_00121ee2;
      }
      if (type == 0x85b9) {
        nn_list_erase((nn_list *)&self[8].ctx,(nn_list_item *)((long)srcptr + 0x730));
        nn_aipc_term((nn_aipc *)srcptr);
        nn_free(srcptr);
        return;
      }
      if (type == 0x85b8) {
        nn_aipc_stop((nn_aipc *)srcptr);
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 2;
      uVar4 = 2;
      uVar5 = 300;
    }
    break;
  default:
    pcVar3 = "Unexpected state";
    uVar5 = 0x174;
    break;
  case 7:
    if (src == 3) {
      if (type == 1) {
        nn_backoff_stop((nn_backoff *)&self[8].stopped.src);
        *(undefined4 *)&self[1].fn = 9;
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 7;
      uVar4 = 3;
      uVar5 = 0x155;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 7;
      uVar5 = 0x159;
    }
    break;
  case 8:
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 7) {
        nn_backoff_start((nn_backoff *)&self[8].stopped.src);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      pcVar3 = "Unexpected action";
      uVar2 = 8;
      uVar4 = 1;
      uVar5 = 0x13f;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 8;
      uVar5 = 0x143;
    }
    break;
  case 9:
    if (src == 3) {
      if (type == 2) goto LAB_00121da3;
      pcVar3 = "Unexpected action";
      uVar2 = 9;
      uVar4 = 3;
      uVar5 = 0x169;
    }
    else {
      pcVar3 = "Unexpected source";
      uVar2 = 9;
      uVar5 = 0x16d;
    }
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar4,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
          ,uVar5);
LAB_00121ee2:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bipc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bipc *bipc;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    switch (bipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_bipc_start_listening (bipc);
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aipc state machine in this state.         */
/******************************************************************************/
    case NN_BIPC_STATE_ACTIVE:
        if (srcptr == bipc->aipc) {
            switch (type) {
            case NN_AIPC_ACCEPTED:

                /*  Move the newly created connection to the list of existing
                    connections. */
                nn_list_insert (&bipc->aipcs, &bipc->aipc->item,
                    nn_list_end (&bipc->aipcs));
                bipc->aipc = NULL;

                /*  Start waiting for a new incoming connection. */
                nn_bipc_start_accepting (bipc);

                return;

            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child aipc objects. */
        nn_assert (src == NN_BIPC_SRC_AIPC);
        aipc = (struct nn_aipc*) srcptr;
        switch (type) {
        case NN_AIPC_ERROR:
            nn_aipc_stop (aipc);
            return;
        case NN_AIPC_STOPPED:
            nn_list_erase (&bipc->aipcs, &aipc->item);
            nn_aipc_term (aipc);
            nn_free (aipc);
            return;
        default:
            nn_fsm_bad_action (bipc->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_BIPC_STATE_CLOSING:
        switch (src) {

        case NN_BIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&bipc->retry);
                bipc->state = NN_BIPC_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-bind is attempted. This way we won't overload           */
/*  the system by continuous re-bind attemps.                                 */
/******************************************************************************/
    case NN_BIPC_STATE_WAITING:
        switch (src) {

        case NN_BIPC_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&bipc->retry);
                bipc->state = NN_BIPC_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_BIPC_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_BIPC_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_bipc_start_listening (bipc);
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bipc->state, src, type);
    }
}